

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

bool spdlog::details::os::file_exists(filename_t *filename)

{
  char *__file;
  int iVar1;
  undefined1 local_a0 [8];
  stat buffer;
  filename_t *filename_local;
  
  buffer.__glibc_reserved[2] = (__syscall_slong_t)filename;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a0);
  return iVar1 == 0;
}

Assistant:

inline bool file_exists(const filename_t &filename) SPDLOG_NOEXCEPT
{
#ifdef _WIN32
#ifdef SPDLOG_WCHAR_FILENAMES
    auto attribs = GetFileAttributesW(filename.c_str());
#else
    auto attribs = GetFileAttributesA(filename.c_str());
#endif
    return (attribs != INVALID_FILE_ATTRIBUTES && !(attribs & FILE_ATTRIBUTE_DIRECTORY));
#else // common linux/unix all have the stat system call
    struct stat buffer;
    return (stat(filename.c_str(), &buffer) == 0);
#endif
}